

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::CleanupWeakReferenceDictionaries(ScriptContext *this)

{
  code *pcVar1;
  IWeakReferenceDictionary *this_00;
  bool bVar2;
  undefined4 *puVar3;
  Type_conflict node;
  Type *ppIVar4;
  IWeakReferenceDictionary *weakReferenceDictionary;
  Iterator iter;
  ScriptContext *this_local;
  
  if ((this->isWeakReferenceDictionaryListCleared & 1U) == 0) {
    iter.current = (NodeBase *)this;
    SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>::Iterator::
    Iterator((Iterator *)&weakReferenceDictionary,&this->weakReferenceDictionaryList);
    while( true ) {
      if (iter.list ==
          (SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this_00 = weakReferenceDictionary;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>::
              IsHead((SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>
                      *)this_00,node);
      if (bVar2) break;
      iter.list = (SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>
                   *)SListNodeBase<Memory::ArenaAllocator>::Next
                               (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppIVar4 = SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>::
                Iterator::Data((Iterator *)&weakReferenceDictionary);
      (**(*ppIVar4)->_vptr_IWeakReferenceDictionary)();
    }
  }
  return;
}

Assistant:

void ScriptContext::CleanupWeakReferenceDictionaries()
    {
        if (!isWeakReferenceDictionaryListCleared)
        {
            SListBase<JsUtil::IWeakReferenceDictionary*>::Iterator iter(&this->weakReferenceDictionaryList);

            while (iter.Next())
            {
                JsUtil::IWeakReferenceDictionary* weakReferenceDictionary = iter.Data();

                weakReferenceDictionary->Cleanup();
            }
        }
    }